

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_namespace_setNewSymbolBindingWithValue
               (sysbvm_context_t *context,sysbvm_tuple_t nspace,sysbvm_tuple_t symbol,
               sysbvm_tuple_t value)

{
  _Bool _Var1;
  sysbvm_tuple_t binding_00;
  sysbvm_tuple_t binding;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t symbol_local;
  sysbvm_tuple_t nspace_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(nspace);
  if (!_Var1) {
    sysbvm_error("Expected a namespace.");
  }
  binding_00 = sysbvm_symbolValueBinding_create(context,0,symbol,value);
  sysbvm_environment_setNewBinding(context,nspace,binding_00);
  _Var1 = sysbvm_tuple_isFunction(context,value);
  if (_Var1) {
    sysbvm_function_recordBindingWithOwnerAndName(context,value,nspace,symbol);
  }
  else {
    sysbvm_programEntity_recordBindingWithOwnerAndName(context,value,nspace,symbol);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_namespace_setNewSymbolBindingWithValue(sysbvm_context_t *context, sysbvm_tuple_t nspace, sysbvm_tuple_t symbol, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(nspace))
        sysbvm_error("Expected a namespace.");

    sysbvm_tuple_t binding = sysbvm_symbolValueBinding_create(context, SYSBVM_NULL_TUPLE, symbol, value);
    sysbvm_environment_setNewBinding(context, nspace, binding);

    if(sysbvm_tuple_isFunction(context, value))
        sysbvm_function_recordBindingWithOwnerAndName(context, value, nspace, symbol);
    else
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, value, nspace, symbol);
}